

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall testing::internal::StreamingListener::Start(StreamingListener *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"gtest_streaming_protocol_version=1.0",&local_31);
  SendLn(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Start() { SendLn("gtest_streaming_protocol_version=1.0"); }